

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_magestaff.cpp
# Opt level: O2

int __thiscall AMageStaffFX2::SpecialMissileHit(AMageStaffFX2 *this,AActor *victim)

{
  TObjPtr<AActor> *obj;
  int iVar1;
  AActor *pAVar2;
  DAngle angle;
  FName local_24;
  undefined8 local_20;
  
  obj = &(this->super_AActor).target;
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
  iVar1 = -1;
  if (((pAVar2 != victim) && (victim->player == (player_t *)0x0)) &&
     (((victim->flags2).Value & 0x8000) == 0)) {
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
    local_24.Index = 0x9f;
    local_20 = 0;
    P_DamageMobj(victim,&this->super_AActor,pAVar2,10,&local_24,0,angle);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int AMageStaffFX2::SpecialMissileHit (AActor *victim)
{
	if (victim != target &&
		!victim->player &&
		!(victim->flags2 & MF2_BOSS))
	{
		P_DamageMobj (victim, this, target, 10, NAME_Fire);
		return 1;	// Keep going
	}
	return -1;
}